

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfp_helper.c
# Opt level: O0

void dfp_check_for_VXISI(PPC_DFP *dfp,int testForSameSign)

{
  decClass dVar1;
  decClass dVar2;
  int same;
  int testForSameSign_local;
  PPC_DFP *dfp_local;
  
  if (((((dfp->context).status & 0x80) != 0) && (((dfp->a).bits & 0x40) != 0)) &&
     (((dfp->b).bits & 0x40) != 0)) {
    dVar1 = decNumberClass((decNumber_conflict *)&dfp->a,&dfp->context);
    dVar2 = decNumberClass((decNumber_conflict *)&dfp->b,&dfp->context);
    if (((dVar1 == dVar2) && (testForSameSign != 0)) || ((dVar1 != dVar2 && (testForSameSign == 0)))
       ) {
      dfp_set_FPSCR_flag(dfp,0x20800000,0x80);
    }
  }
  return;
}

Assistant:

static void dfp_check_for_VXISI(struct PPC_DFP *dfp, int testForSameSign)
{
    if (dfp->context.status & DEC_Invalid_operation) {
        if (decNumberIsInfinite(&dfp->a) && decNumberIsInfinite(&dfp->b)) {
            int same = decNumberClass(&dfp->a, &dfp->context) ==
                       decNumberClass(&dfp->b, &dfp->context);
            if ((same && testForSameSign) || (!same && !testForSameSign)) {
                dfp_set_FPSCR_flag(dfp, FP_VX | FP_VXISI, FP_VE);
            }
        }
    }
}